

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath.cpp
# Opt level: O3

string * directoryOf(string *__return_storage_ptr__,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_type sVar5;
  
  sVar5 = filename->_M_string_length;
  while (sVar5 != 0) {
    cVar2 = (filename->_M_dataplus)._M_p[sVar5 - 1];
    if ((cVar2 == '/') || (cVar2 == '\\')) goto LAB_001381e1;
    std::__cxx11::string::pop_back();
    sVar5 = filename->_M_string_length;
  }
  sVar5 = 0;
LAB_001381e1:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (filename->_M_dataplus)._M_p;
  paVar1 = &filename->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&filename->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = sVar5;
  (filename->_M_dataplus)._M_p = (pointer)paVar1;
  filename->_M_string_length = 0;
  (filename->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string directoryOf(std::string filename) {
	while (!filename.empty() && filename.back()!='\\' && filename.back()!='/')
		filename.pop_back();
	return filename;
}